

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntStartFull(int nSize)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar2->pArray = (int *)0x0;
    pVVar2->nSize = nSize;
  }
  else {
    __s = (int *)malloc((long)iVar1 << 2);
    pVVar2->pArray = __s;
    pVVar2->nSize = nSize;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)nSize << 2);
    }
  }
  return pVVar2;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartFull( int nSize )
{
    Vec_Int_t * p;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    if ( p->pArray ) memset( p->pArray, 0xff, sizeof(int) * (size_t)nSize );
    return p;
}